

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Mapper2_write_and_read_byte_cpu_bus_Test::TestBody
          (Mapper2_write_and_read_byte_cpu_bus_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  pointer pIVar4;
  char *pcVar5;
  Mapper in_R8D;
  AssertHelper local_2c8;
  Message local_2c0;
  uchar local_2b5;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_5;
  Message local_298;
  uchar local_28d;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  Message local_270;
  uchar local_265;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  Message local_248;
  uchar local_23d;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  Message local_220;
  uchar local_215;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8;
  uchar local_1ed;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> rom;
  stringstream ss;
  undefined1 local_38 [8];
  string bytes;
  int kPrgRomBanks;
  Mapper2_write_and_read_byte_cpu_bus_Test *this_local;
  
  bytes.field_2._12_4_ = 8;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_38,(_anonymous_namespace_ *)0x8,'\x01','\x02',in_R8D);
  set_prg_rom_byte(8,(string *)local_38,0,'\x01');
  set_prg_rom_byte(8,(string *)local_38,0x4000,'\x02');
  set_prg_rom_byte(8,(string *)local_38,0x1c000,'\a');
  set_prg_rom_byte(8,(string *)local_38,0x1c001,0xab);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&rom,(string *)local_38,_Var2);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar.message_,(istream *)&rom);
  local_1ec = 1;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0x8000);
  local_1ed = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_1e8,"0x01","rom->cpu_read_byte(0x8000)",&local_1ec,&local_1ed);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x13e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_214 = 7;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0xc000);
  local_215 = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_210,"0x07","rom->cpu_read_byte(0xC000)",&local_214,&local_215);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x141,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_23c = 0xab;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0xc001);
  local_23d = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_238,"0xAB","rom->cpu_read_byte(0xC001)",&local_23c,&local_23d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x142,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  (*pIVar4->_vptr_IRom[4])(pIVar4,0x8000,1);
  local_264 = 2;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0x8000);
  local_265 = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_260,"0x02","rom->cpu_read_byte(0x8000)",&local_264,&local_265);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x146,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_28c = 7;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0xc000);
  local_28d = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_288,"0x07","rom->cpu_read_byte(0xC000)",&local_28c,&local_28d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x149,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2b4 = 0xab;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[3])(pIVar4,0xc001);
  local_2b5 = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_2b0,"0xAB","rom->cpu_read_byte(0xC001)",&local_2b4,&local_2b5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x14a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&rom);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(Mapper2, write_and_read_byte_cpu_bus) {
    constexpr int kPrgRomBanks = 8;
    std::string bytes{nrom_bytes(kPrgRomBanks, 1, Mapper::Mapper2)};
    // First byte in first bank
    set_prg_rom_byte(kPrgRomBanks, &bytes, 0u * 0x4000u, 0x01);
    // First byte in second bank
    set_prg_rom_byte(kPrgRomBanks, &bytes, 1u * 0x4000u, 0x02);
    // First byte in last bank
    set_prg_rom_byte(kPrgRomBanks, &bytes, 7u * 0x4000u, 0x07);
    // Second byte in last bank
    set_prg_rom_byte(kPrgRomBanks, &bytes, 7u * 0x4000u + 1u, 0xAB);

    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    // $8000-$BFFF: 16 KB switchable PRG ROM bank
    EXPECT_EQ(0x01, rom->cpu_read_byte(0x8000));

    // $C000-$FFFF: 16 KB PRG ROM bank, fixed to the last bank
    EXPECT_EQ(0x07, rom->cpu_read_byte(0xC000));
    EXPECT_EQ(0xAB, rom->cpu_read_byte(0xC001));

    // Write to rom to switch bank
    rom->cpu_write_byte(0x8000, 0x01);
    EXPECT_EQ(0x02, rom->cpu_read_byte(0x8000));

    // Last bank should not be affected
    EXPECT_EQ(0x07, rom->cpu_read_byte(0xC000));
    EXPECT_EQ(0xAB, rom->cpu_read_byte(0xC001));
}